

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprWhile * AnalyzeWhile(ExpressionContext *ctx,SynWhile *syntax)

{
  ExprBase *pEVar1;
  ExprWhile *this;
  ExprBase *local_30;
  ExprBase *body;
  ExprBase *condition;
  SynWhile *syntax_local;
  ExpressionContext *ctx_local;
  
  ExpressionContext::PushLoopScope(ctx,true,true);
  pEVar1 = AnalyzeExpression(ctx,syntax->condition);
  if (syntax->body == (SynBase *)0x0) {
    local_30 = &ExpressionContext::get<ExprVoid>(ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)local_30,&syntax->super_SynBase,ctx->typeVoid);
  }
  else {
    local_30 = AnalyzeStatement(ctx,syntax->body);
  }
  pEVar1 = CreateConditionCast(ctx,pEVar1->source,pEVar1);
  ExpressionContext::PopScope(ctx,SCOPE_LOOP);
  this = ExpressionContext::get<ExprWhile>(ctx);
  ExprWhile::ExprWhile(this,&syntax->super_SynBase,ctx->typeVoid,pEVar1,local_30);
  return this;
}

Assistant:

ExprWhile* AnalyzeWhile(ExpressionContext &ctx, SynWhile *syntax)
{
	ctx.PushLoopScope(true, true);

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);
	ExprBase *body = syntax->body ? AnalyzeStatement(ctx, syntax->body) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	condition = CreateConditionCast(ctx, condition->source, condition);

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprWhile>()) ExprWhile(syntax, ctx.typeVoid, condition, body);
}